

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmCommonTargetGenerator::GetAIXExports
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this,string *param_1)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  allocator<char> local_61;
  string local_60;
  cmValue local_40;
  cmValue exportAll;
  string *param_1_local;
  cmCommonTargetGenerator *this_local;
  string *aixExports;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = cmGeneratorTarget::IsAIX(this->GeneratorTarget);
  if (bVar1) {
    this_00 = this->GeneratorTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"AIX_EXPORT_ALL_SYMBOLS",&local_61);
    local_40 = cmGeneratorTarget::GetProperty(this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    bVar1 = cmValue::operator_cast_to_bool(&local_40);
    if ((bVar1) && (bVar1 = cmValue::IsOff(&local_40), bVar1)) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"-n");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::GetAIXExports(std::string const&)
{
  std::string aixExports;
  if (this->GeneratorTarget->IsAIX()) {
    if (cmValue exportAll =
          this->GeneratorTarget->GetProperty("AIX_EXPORT_ALL_SYMBOLS")) {
      if (exportAll.IsOff()) {
        aixExports = "-n";
      }
    }
  }
  return aixExports;
}